

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_geom_face(REF_GRID ref_grid,REF_INT node)

{
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_ADJ pRVar2;
  REF_GEOM ref_geom_00;
  REF_ADJ_ITEM pRVar3;
  REF_ADAPT pRVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  undefined8 uVar11;
  uint uVar12;
  char *pcVar13;
  REF_DBL *pRVar14;
  int iVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  ulong uStackY_530;
  REF_INT id_2;
  REF_GEOM local_518;
  REF_INT local_50c;
  REF_GEOM local_508;
  long local_500;
  REF_INT id_1;
  REF_INT local_4ec;
  uint local_4e8;
  REF_INT id;
  double local_4e0;
  undefined1 local_4d8 [16];
  REF_INTERP local_4c8;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  double local_4b0;
  undefined1 local_4a8 [16];
  REF_DBL xyz_orig [3];
  REF_DBL qtet;
  REF_DBL q2;
  REF_DBL q1;
  REF_INT nnode;
  undefined4 uStack_45c;
  REF_BOOL geom_face;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  REF_INT geom;
  double local_448;
  undefined8 uStack_440;
  REF_NODE local_438;
  undefined8 uStack_430;
  REF_DBL normdev;
  double dStack_420;
  double local_418;
  double local_408;
  double local_400;
  long local_3f8;
  REF_NODE local_3f0;
  REF_DBL qtri;
  double local_3e0;
  REF_DBL r [3];
  undefined1 local_3b8 [16];
  REF_DBL dxyz [3];
  REF_DBL normdev_orig;
  REF_DBL qtri_orig;
  REF_DBL qtet_orig;
  undefined1 local_378 [16];
  REF_GEOM local_368;
  double dStack_360;
  REF_DBL uv_orig [2];
  REF_DBL q0;
  REF_DBL s [3];
  REF_DBL uv_min [2];
  REF_DBL aRStack_2f0 [13];
  REF_DBL uv_max [2];
  REF_DBL aRStack_270 [11];
  REF_DBL min_uv_area;
  REF_DBL uv [2];
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_1a0;
  
  pRVar1 = ref_grid->node;
  ref_geom = ref_grid->geom;
  qtri = 0.0;
  qtet = 0.0;
  local_4c8 = ref_grid->interp;
  if ((-1 < node) &&
     (((((pRVar2 = ref_grid->cell[6]->ref_adj, node < pRVar2->nnode &&
         (pRVar2->first[(uint)node] != -1)) ||
        ((pRVar2 = ref_grid->cell[10]->ref_adj, node < pRVar2->nnode &&
         (pRVar2->first[(uint)node] != -1)))) ||
       ((pRVar2 = ref_grid->cell[9]->ref_adj, node < pRVar2->nnode &&
        (pRVar2->first[(uint)node] != -1)))) ||
      ((pRVar2 = ref_grid->cell[0xb]->ref_adj, node < pRVar2->nnode &&
       (pRVar2->first[(uint)node] != -1)))))) {
    return 0;
  }
  uVar7 = ref_geom_is_a(ref_geom,node,0,&geom_node);
  if (uVar7 != 0) {
    uStackY_530 = (ulong)uVar7;
    pcVar13 = "node check";
    uVar11 = 0x6b3;
    goto LAB_001c1cb4;
  }
  local_3f0 = pRVar1;
  uVar7 = ref_geom_is_a(ref_geom,node,1,&geom_edge);
  if (uVar7 != 0) {
    pcVar13 = "edge check";
    uVar11 = 0x6b4;
LAB_001c1d49:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar11
           ,"ref_smooth_geom_face",(ulong)uVar7,pcVar13);
    return uVar7;
  }
  uVar7 = ref_geom_is_a(ref_geom,node,2,&geom_face);
  if (uVar7 != 0) {
    pcVar13 = "face check";
    uVar11 = 0x6b5;
    goto LAB_001c1d49;
  }
  bVar16 = true;
  if ((-1 < node) && (pRVar2 = ref_grid->cell[6]->ref_adj, node < pRVar2->nnode)) {
    bVar16 = pRVar2->first[(uint)node] == -1;
  }
  if (geom_node != 0) {
    pcVar13 = "geom node not allowed";
    uVar11 = 0x6b7;
LAB_001c1de0:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar11
           ,"ref_smooth_geom_face",pcVar13);
    return 1;
  }
  if (geom_edge != 0) {
    pcVar13 = "geom edge not allowed";
    uVar11 = 0x6b8;
    goto LAB_001c1de0;
  }
  if (geom_face == 0) {
    pcVar13 = "geom face required";
    uVar11 = 0x6b9;
    goto LAB_001c1de0;
  }
  if (!bVar16) {
    pcVar13 = "quads not allowed";
    uVar11 = 0x6ba;
    goto LAB_001c1de0;
  }
  uVar7 = ref_geom_unique_id(ref_geom,node,2,&id);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x6bd,
           "ref_smooth_geom_face",(ulong)uVar7,"get-id");
    ref_clump_around(ref_grid,node,"get-id.tec");
    return uVar7;
  }
  uVar7 = ref_geom_tuv(ref_geom,node,2,id,uv_orig);
  if (uVar7 != 0) {
    uStackY_530 = (ulong)uVar7;
    pcVar13 = "get uv_orig";
    uVar11 = 0x6be;
    goto LAB_001c1cb4;
  }
  if (ref_grid->surf == 0) {
    uVar7 = ref_smooth_tet_quality_around(ref_grid,node,&qtet_orig);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x6c5,"ref_smooth_geom_face",(ulong)uVar7,"q tet");
      pRVar14 = local_3f0->real;
      lVar9 = (long)(node * 0xf);
      printf(" %f %f %f\n",SUB84(pRVar14[lVar9],0),pRVar14[lVar9 + 1],pRVar14[lVar9 + 2]);
      return uVar7;
    }
  }
  else {
    qtet_orig = 1.0;
  }
  uVar7 = ref_smooth_tri_quality_around(ref_grid,node,&qtri_orig);
  if (uVar7 != 0) {
    uStackY_530 = (ulong)uVar7;
    pcVar13 = "q tri";
    uVar11 = 0x6c7;
    goto LAB_001c1cb4;
  }
  uVar7 = ref_smooth_tri_normdev_around(ref_grid,node,&normdev_orig);
  if (uVar7 != 0) {
    uStackY_530 = (ulong)uVar7;
    pcVar13 = "nd_orig";
    uVar11 = 0x6c8;
    goto LAB_001c1cb4;
  }
  uVar7 = ref_smooth_tri_ratio_around(ref_grid,node,&min_ratio,&max_ratio);
  if (uVar7 != 0) {
    uStackY_530 = (ulong)uVar7;
    pcVar13 = "ratio";
    uVar11 = 0x6ca;
    goto LAB_001c1cb4;
  }
  local_4e8 = 0;
  local_400 = qtri_orig;
  if ((0.5 < qtri_orig) && (0.5 < min_ratio)) {
    local_4e8 = (uint)(max_ratio < 2.0);
  }
  local_4ec = -1;
  local_3f8 = (long)node;
  if ((local_4c8 != (REF_INTERP)0x0) && (local_4c8->continuously != 0)) {
    local_4ec = local_4c8->cell[local_3f8];
  }
  if ((char)local_4e8 == '\0') {
    local_4d8 = ZEXT816(0);
    uVar7 = ref_smooth_tri_quality_around(ref_grid,node,&local_4b0);
    if (uVar7 == 0) {
      if (local_4b0 < 0.0) {
        local_408 = sqrt(local_4b0);
      }
      else {
        local_408 = SQRT(local_4b0);
      }
      local_50c = -1;
      local_500 = 0xffffffff;
      if (-1 < node) {
        pRVar2 = ref_grid->cell[3]->ref_adj;
        local_500 = 0xffffffff;
        local_50c = -1;
        if (node < pRVar2->nnode) {
          lVar9 = (long)pRVar2->first[(uint)node];
          local_500 = 0xffffffff;
          local_50c = -1;
          if (lVar9 != -1) {
            local_50c = pRVar2->item[lVar9].ref;
            local_500 = lVar9;
          }
        }
      }
      local_4e0 = 0.0;
      while ((int)local_500 != -1) {
        local_438 = ref_grid->node;
        ref_geom_00 = ref_grid->geom;
        s[0] = 0.0;
        s[1] = 0.0;
        uVar7 = ref_cell_nodes(ref_grid->cell[3],local_50c,(REF_INT *)uv_min);
        if (uVar7 != 0) {
          uStackY_530 = (ulong)uVar7;
          pcVar13 = "get tri";
          uVar11 = 0x193;
          goto LAB_001c29b0;
        }
        iVar10 = -1;
        iVar15 = -1;
        if (uv_min[0]._0_4_ == node) {
          iVar10 = uv_min[0]._4_4_;
          iVar15 = uv_min[1]._0_4_;
        }
        if (uv_min[0]._4_4_ == node) {
          iVar10 = uv_min[1]._0_4_;
          iVar15 = uv_min[0]._0_4_;
        }
        if (uv_min[1]._0_4_ == node) {
          iVar10 = uv_min[0]._0_4_;
          iVar15 = uv_min[0]._4_4_;
        }
        if ((iVar10 == -1) || (iVar15 == -1)) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x1a3,"ref_smooth_tri_ideal_uv","empty triangle side");
          uStackY_530 = 1;
LAB_001c29ba:
          pcVar13 = "tri ideal";
          uVar11 = 0x299;
          goto LAB_001c29db;
        }
        uv_min[0]._0_4_ = node;
        uv_min[0]._4_4_ = iVar10;
        uv_min[1]._0_4_ = iVar15;
        uVar7 = ref_geom_unique_id(ref_geom_00,node,2,&id_2);
        if (uVar7 != 0) {
          uStackY_530 = (ulong)uVar7;
          pcVar13 = "id";
          uVar11 = 0x1a9;
LAB_001c29b0:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 uVar11,"ref_smooth_tri_ideal_uv",uStackY_530,pcVar13);
          goto LAB_001c29ba;
        }
        uVar7 = ref_geom_tuv(ref_geom_00,node,2,id_2,dxyz);
        if (uVar7 != 0) {
          uStackY_530 = (ulong)uVar7;
          pcVar13 = "uv";
          uVar11 = 0x1aa;
          goto LAB_001c29b0;
        }
        uVar7 = ref_geom_find(ref_geom_00,node,2,id_2,&geom);
        if (uVar7 != 0) {
          uStackY_530 = (ulong)uVar7;
          pcVar13 = "geom";
          uVar11 = 0x1ab;
          goto LAB_001c29b0;
        }
        uVar7 = ref_node_tri_quality(local_438,(REF_INT *)uv_min,&q0);
        if (uVar7 != 0) {
          uStackY_530 = (ulong)uVar7;
          pcVar13 = "qual";
          uVar11 = 0x1af;
          goto LAB_001c29b0;
        }
        xyz_orig[0] = dxyz[0];
        xyz_orig[1] = dxyz[1];
        _id_1 = q0;
        local_518 = (REF_GEOM)0x0;
        local_448 = (double)((ulong)local_448 & 0xffffffff00000000);
        local_508 = (REF_GEOM)0x0;
        while( true ) {
          if ((0x1d < local_448._0_4_) || (local_408 <= _id_1)) goto LAB_001c2878;
          uVar7 = ref_geom_add(ref_geom_00,node,2,id_2,xyz_orig);
          if (uVar7 != 0) {
            uStackY_530 = (ulong)uVar7;
            pcVar13 = "set uv";
            uVar11 = 0x1b7;
            goto LAB_001c29b0;
          }
          uVar7 = ref_smooth_tri_uv_area_around(ref_grid,node,(REF_DBL *)&nnode);
          if (uVar7 != 0) {
            uStackY_530 = (ulong)uVar7;
            pcVar13 = "min area";
            uVar11 = 0x1b9;
            goto LAB_001c29b0;
          }
          if ((double)CONCAT44(uStack_45c,nnode) <= local_438->min_uv_area) {
            xyz_orig[0] = dxyz[0];
            xyz_orig[1] = dxyz[1];
            goto LAB_001c2878;
          }
          uVar7 = ref_geom_constrain(ref_grid,node);
          if (uVar7 != 0) {
            uStackY_530 = (ulong)uVar7;
            pcVar13 = "constrain";
            uVar11 = 0x1c0;
            goto LAB_001c29b0;
          }
          uVar7 = ref_node_tri_dquality_dnode0
                            (local_438,(REF_INT *)uv_min,(REF_DBL *)&id_1,&normdev);
          if (uVar7 != 0) {
            uStackY_530 = (ulong)uVar7;
            pcVar13 = "qual";
            uVar11 = 0x1c1;
            goto LAB_001c29b0;
          }
          uVar7 = ref_egads_eval(ref_geom_00,geom,&min_uv_area,uv);
          if (uVar7 != 0) {
            uStackY_530 = (ulong)uVar7;
            pcVar13 = "eval face";
            uVar11 = 0x1c2;
            goto LAB_001c29b0;
          }
          local_368 = (REF_GEOM)(local_1b8 * local_418 + uv[0] * normdev + uv[1] * dStack_420);
          dStack_360 = local_1a0 * local_418 + dStack_1b0 * normdev + local_1a8 * dStack_420;
          local_378._8_4_ = SUB84(dStack_360,0);
          local_378._0_8_ = dStack_360;
          local_378._12_4_ = (int)((ulong)dStack_360 >> 0x20);
          local_3b8._8_8_ = dStack_360;
          local_3b8._0_8_ = local_368;
          if (local_448._0_4_ != 0) {
            dVar20 = ((double)local_368 - (double)local_518) * (double)local_368 +
                     (dStack_360 - (double)local_508) * dStack_360;
            dVar22 = (double)local_518 * (double)local_518 + (double)local_508 * (double)local_508;
            auVar19._0_8_ = dVar22 * 1e+20;
            auVar19._8_8_ = dVar20;
            auVar21._0_8_ = -auVar19._0_8_;
            auVar21._8_8_ = -dVar20;
            auVar19 = maxpd(auVar19,auVar21);
            dVar20 = (double)(-(ulong)(auVar19._8_8_ < auVar19._0_8_) & (ulong)(dVar20 / dVar22));
            uVar17 = 0;
            uVar18 = 0;
            if (0.0 <= dVar20) {
              uVar17 = SUB84(dVar20,0);
              uVar18 = (undefined4)((ulong)dVar20 >> 0x20);
            }
            dVar20 = (double)CONCAT44(uVar18,uVar17) * (double)local_4a8._8_8_ + dStack_360;
            local_3b8._8_4_ = SUB84(dVar20,0);
            local_3b8._0_8_ =
                 (double)CONCAT44(uVar18,uVar17) * (double)local_4a8._0_8_ + (double)local_368;
            local_3b8._12_4_ = (int)((ulong)dVar20 >> 0x20);
          }
          r[0] = (REF_DBL)local_3b8._0_8_;
          r[1] = (REF_DBL)local_3b8._8_8_;
          local_4a8._0_8_ =
               (1.0 - _id_1) /
               SQRT((double)local_3b8._0_8_ * (double)local_3b8._0_8_ +
                    (double)local_3b8._8_8_ * (double)local_3b8._8_8_);
          local_518 = (REF_GEOM)(((double)local_4a8._0_8_ + 0.0) * 0.5);
          uVar7 = ref_smooth_tri_quality(ref_grid,node,id_2,(REF_INT *)uv_min,xyz_orig,r,0.0,&q1);
          if (uVar7 != 0) {
            uStackY_530 = (ulong)uVar7;
            pcVar13 = "set uv for q1";
            uVar11 = 0x1e3;
            goto LAB_001c29b0;
          }
          uVar7 = ref_smooth_tri_quality
                            (ref_grid,node,id_2,(REF_INT *)uv_min,xyz_orig,r,(REF_DBL)local_518,&q2)
          ;
          if (uVar7 != 0) {
            uStackY_530 = (ulong)uVar7;
            pcVar13 = "set uv for q2";
            uVar11 = 0x1e6;
            goto LAB_001c29b0;
          }
          uVar7 = ref_smooth_tri_quality
                            (ref_grid,node,id_2,(REF_INT *)uv_min,xyz_orig,r,
                             (REF_DBL)local_4a8._0_8_,&local_3e0);
          if (uVar7 != 0) {
            uStackY_530 = (ulong)uVar7;
            pcVar13 = "set uv for q3";
            uVar11 = 0x1e9;
            goto LAB_001c29b0;
          }
          local_508 = (REF_GEOM)0x0;
          iVar15 = 0x10;
          while (iVar15 = iVar15 + -1, iVar15 != 0) {
            if (q1 <= local_3e0) {
              q1 = q2;
              local_508 = local_518;
              local_518 = (REF_GEOM)local_4a8._0_8_;
            }
            else {
              local_3e0 = q2;
              local_4a8._0_8_ = local_518;
            }
            local_518 = (REF_GEOM)(((double)local_518 + (double)local_508) * 0.5);
            uVar7 = ref_smooth_tri_quality
                              (ref_grid,node,id_2,(REF_INT *)uv_min,xyz_orig,r,(REF_DBL)local_518,
                               &q2);
            if (uVar7 != 0) {
              uStackY_530 = (ulong)uVar7;
              pcVar13 = "set uv for q2";
              uVar11 = 0x1f5;
              goto LAB_001c29b0;
            }
          }
          if (q2 < q1) break;
          uVar7 = ref_geom_tuv(ref_geom_00,node,2,id_2,xyz_orig);
          local_448 = (double)CONCAT44(local_448._4_4_,local_448._0_4_ + 1);
          local_518 = local_368;
          local_508 = (REF_GEOM)local_378._0_8_;
          local_4a8 = local_3b8;
          if (uVar7 != 0) {
            uStackY_530 = (ulong)uVar7;
            pcVar13 = "uv";
            uVar11 = 0x1fe;
            goto LAB_001c29b0;
          }
        }
        uVar7 = ref_smooth_tri_quality
                          (ref_grid,node,id_2,(REF_INT *)uv_min,xyz_orig,r,(REF_DBL)local_508,&q1);
        if (uVar7 != 0) {
          uStackY_530 = (ulong)uVar7;
          pcVar13 = "set uv for q1";
          uVar11 = 0x1fa;
          goto LAB_001c29b0;
        }
        uVar7 = ref_geom_tuv(ref_geom_00,node,2,id_2,xyz_orig);
        if (uVar7 != 0) {
          uStackY_530 = (ulong)uVar7;
          pcVar13 = "uv";
          uVar11 = 0x1fb;
          goto LAB_001c29b0;
        }
LAB_001c2878:
        uVar7 = ref_geom_add(ref_geom_00,node,2,id_2,dxyz);
        if (uVar7 != 0) {
          uStackY_530 = (ulong)uVar7;
          pcVar13 = "set uv";
          uVar11 = 0x20c;
          goto LAB_001c29b0;
        }
        uVar7 = ref_geom_constrain(ref_grid,node);
        if (uVar7 != 0) {
          uStackY_530 = (ulong)uVar7;
          pcVar13 = "constrain";
          uVar11 = 0x20d;
          goto LAB_001c29b0;
        }
        s[0] = xyz_orig[0];
        s[1] = xyz_orig[1];
        uVar7 = ref_cell_nodes(ref_grid->cell[3],local_50c,(REF_INT *)uv_max);
        if (uVar7 != 0) {
          uStackY_530 = (ulong)uVar7;
          pcVar13 = "nodes";
          uVar11 = 0x29a;
          goto LAB_001c29db;
        }
        uVar7 = ref_node_tri_quality(ref_grid->node,(REF_INT *)uv_max,&local_4b0);
        if (uVar7 != 0) {
          uStackY_530 = (ulong)uVar7;
          pcVar13 = "tri qual";
          uVar11 = 0x29c;
          goto LAB_001c29db;
        }
        dVar20 = ref_grid->adapt->smooth_min_quality;
        if (local_4b0 <= dVar20) {
          local_4b0 = dVar20;
        }
        for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
          *(double *)(local_4d8 + lVar9 * 8) =
               s[lVar9] * (1.0 / local_4b0) + *(double *)(local_4d8 + lVar9 * 8);
        }
        local_4e0 = local_4e0 + 1.0 / local_4b0;
        pRVar3 = ref_grid->cell[3]->ref_adj->item;
        local_500 = (long)pRVar3[(int)local_500].next;
        local_50c = -1;
        if (local_500 != -1) {
          local_50c = pRVar3[local_500].ref;
        }
      }
      dVar20 = local_4e0 * 1e+20;
      if (dVar20 <= -dVar20) {
        dVar20 = -dVar20;
      }
      if (1.0 < dVar20) {
        for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
          *(double *)(local_4d8 + lVar9 * 8) =
               *(double *)(local_4d8 + lVar9 * 8) * (1.0 / local_4e0);
        }
LAB_001c2f73:
        uVar7 = ref_geom_tri_uv_bounding_box(ref_grid,node,uv_min,uv_max);
        if (uVar7 == 0) {
          local_438 = (REF_NODE)normdev_orig;
          uStack_430 = 0;
          local_448 = normdev_orig * 0.9;
          uStack_440 = 0;
          local_4a8._0_8_ = local_400 * 0.9;
          local_4a8._8_8_ = 0;
          local_508 = (REF_GEOM)((ulong)local_508 & 0xffffffff00000000);
          local_518 = (REF_GEOM)0x3ff0000000000000;
          uVar12 = 0;
          while( true ) {
            if ((int)local_508 == 8) {
              uVar7 = ref_geom_add(ref_geom,node,2,id,uv_orig);
              if (uVar7 == 0) {
                uVar7 = ref_geom_constrain(ref_grid,node);
                if (uVar7 == 0) {
                  uVar7 = ref_metric_interpolate_node(ref_grid,node);
                  if ((uVar7 != 0) && (uVar7 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x712,"ref_smooth_geom_face",(ulong)uVar7,"interp");
                    uVar12 = uVar7;
                  }
                  if (uVar7 == 5) {
                    return 0;
                  }
                  if (uVar7 == 0) {
                    return 0;
                  }
                  return uVar12;
                }
                pcVar13 = "constrain";
                uVar11 = 0x711;
              }
              else {
                pcVar13 = "set t";
                uVar11 = 0x710;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,uVar11,"ref_smooth_geom_face",(ulong)uVar7,pcVar13);
              return uVar7;
            }
            for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
              uv[lVar9] = *(double *)(local_4d8 + lVar9 * 8) * (double)local_518 +
                          uv_orig[lVar9] * (1.0 - (double)local_518);
            }
            uVar7 = ref_geom_add(ref_geom,node,2,id,uv);
            if (uVar7 != 0) break;
            uVar7 = ref_geom_constrain(ref_grid,node);
            if (uVar7 != 0) {
              pcVar13 = "constrain";
              uVar11 = 0x6e5;
              goto LAB_001c1d49;
            }
            uVar8 = ref_metric_interpolate_node(ref_grid,node);
            if ((uVar8 != 0) && (uVar8 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x6e7,"ref_smooth_geom_face",(ulong)uVar8,"ref_metric_interpolate_node failed"
                    );
              uVar12 = uVar8;
            }
            if ((uVar8 != 5) && (uVar8 != 0)) {
              return uVar12;
            }
            if (ref_grid->surf == 0) {
              uVar7 = ref_smooth_tet_quality_around(ref_grid,node,&qtet);
              if (uVar7 != 0) {
                pcVar13 = "q tet";
                uVar11 = 0x6ee;
                goto LAB_001c1d49;
              }
              uVar7 = ref_smooth_tet_ratio_around(ref_grid,node,&min_ratio,&max_ratio);
              if (uVar7 != 0) {
                pcVar13 = "ratio";
                uVar11 = 0x6f0;
                goto LAB_001c1d49;
              }
            }
            else {
              qtet = 1.0;
              uVar7 = ref_smooth_tri_ratio_around(ref_grid,node,&min_ratio,&max_ratio);
              if (uVar7 != 0) {
                pcVar13 = "ratio";
                uVar11 = 0x6ec;
                goto LAB_001c1d49;
              }
            }
            uVar7 = ref_smooth_tri_quality_around(ref_grid,node,&qtri);
            if (uVar7 != 0) {
              pcVar13 = "q tri";
              uVar11 = 0x6f2;
              goto LAB_001c1d49;
            }
            uVar7 = ref_smooth_tri_normdev_around(ref_grid,node,&normdev);
            if (uVar7 != 0) {
              pcVar13 = "nd";
              uVar11 = 0x6f3;
              goto LAB_001c1d49;
            }
            uVar7 = ref_smooth_tri_uv_area_around(ref_grid,node,&min_uv_area);
            if (uVar7 != 0) {
              pcVar13 = "a";
              uVar11 = 0x6f4;
              goto LAB_001c1d49;
            }
            if (uVar8 == 0) {
              bVar16 = false;
              if ((ref_grid->adapt->post_min_normdev < normdev || (double)local_438 < normdev) &&
                 (local_448 < normdev)) {
                if (min_uv_area < local_3f0->min_uv_area || min_uv_area == local_3f0->min_uv_area)
                goto LAB_001c31a3;
                bVar16 = false;
                if (((((double)CONCAT44(uv_min[0]._4_4_,uv_min[0]._0_4_) <= uv[0] &&
                       uv[0] != (double)CONCAT44(uv_min[0]._4_4_,uv_min[0]._0_4_)) &&
                     (bVar16 = false, uv[0] < uv_max[0])) &&
                    (bVar16 = false,
                    (double)CONCAT44(uv_min[1]._4_4_,uv_min[1]._0_4_) <= uv[1] &&
                    uv[1] != (double)CONCAT44(uv_min[1]._4_4_,uv_min[1]._0_4_))) &&
                   (uv[1] < uv_max[1])) {
                  pRVar4 = ref_grid->adapt;
                  if ((qtet < pRVar4->smooth_min_quality || qtet == pRVar4->smooth_min_quality) ||
                     (min_ratio < pRVar4->post_min_ratio)) goto LAB_001c31a3;
                  bVar16 = max_ratio <= pRVar4->post_max_ratio;
                }
              }
            }
            else {
LAB_001c31a3:
              bVar16 = false;
            }
            if ((char)local_4e8 == '\0') {
              bVar5 = local_400 < qtri;
            }
            else {
              bVar5 = 0.4 < qtri && (double)local_4a8._0_8_ < qtri;
            }
            if ((bool)(bVar16 & bVar5)) {
              return 0;
            }
            local_518 = (REF_GEOM)((double)local_518 * 0.5);
            if (uVar8 != 0 && local_4ec != -1) {
              local_4c8->cell[local_3f8] = local_4ec;
            }
            local_508 = (REF_GEOM)CONCAT44(local_508._4_4_,(int)local_508 + 1);
          }
          pcVar13 = "set uv";
          uVar11 = 0x6e4;
          goto LAB_001c1d49;
        }
        uStackY_530 = (ulong)uVar7;
        pcVar13 = "bb";
        uVar11 = 0x6dd;
        goto LAB_001c1cb4;
      }
      printf("normalization = %e\n",SUB84(local_4e0,0));
      uStackY_530 = 4;
    }
    else {
      uStackY_530 = (ulong)uVar7;
      pcVar13 = "q";
      uVar11 = 0x294;
LAB_001c29db:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             uVar11,"ref_smooth_tri_weighted_ideal_uv",uStackY_530,pcVar13);
    }
    pcVar13 = "ideal";
    uVar11 = 0x6da;
    goto LAB_001c1cb4;
  }
  pRVar1 = ref_grid->node;
  local_518 = ref_grid->geom;
  uVar7 = ref_geom_unique_id(local_518,node,2,&id_1);
  if (uVar7 == 0) {
    uVar7 = ref_geom_tuv(local_518,node,2,id_1,(REF_DBL *)local_4d8);
    if (uVar7 == 0) {
      uVar7 = ref_cell_node_list_around(ref_grid->cell[3],node,100,&nnode,(REF_INT *)uv);
      if (uVar7 == 0) {
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          (&normdev)[lVar9] = 0.0;
        }
        lVar9 = 0;
LAB_001c2a6e:
        if (lVar9 < nnode) goto code_r0x001c2a7b;
        dVar20 = ref_grid->adapt->smooth_pliant_alpha;
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          dxyz[lVar9] = (&normdev)[lVar9] * dVar20;
        }
        uVar7 = ref_egads_eval_at(local_518,2,id_1,(REF_DBL *)local_4d8,xyz_orig,uv_min);
        if (uVar7 == 0) {
          uVar7 = ref_geom_face_rsn(local_518,id_1,(REF_DBL *)local_4d8,r,s,&q0);
          if (uVar7 != 0) {
            uStackY_530 = (ulong)uVar7;
            pcVar13 = "eval orthonormal face system";
            uVar11 = 0x25e;
            goto LAB_001c2f0b;
          }
          for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
            uv_max[lVar9] = uv_min[lVar9];
            aRStack_270[lVar9] = aRStack_2f0[lVar9];
            aRStack_270[lVar9 + 3] = (&q0)[lVar9];
          }
          pRVar14 = &min_uv_area;
          uVar7 = ref_matrix_inv_gen(3,uv_max,pRVar14);
          if (uVar7 != 0) {
            uStackY_530 = (ulong)uVar7;
            pcVar13 = "inverse transformation";
            uVar11 = 0x266;
            goto LAB_001c2f0b;
          }
          lVar9 = 0;
          while( true ) {
            uVar6 = (ulong)local_4d8._8_8_ >> 0x20;
            if (lVar9 == 3) break;
            local_4d8._0_8_ = (double)local_4d8._0_8_ + dxyz[lVar9] * *pRVar14;
            local_4d8._8_8_ = (double)local_4d8._8_8_ + dxyz[lVar9] * pRVar14[1];
            lVar9 = lVar9 + 1;
            pRVar14 = pRVar14 + 3;
          }
          local_4d8._8_4_ = (int)local_4d8._8_8_;
          local_4d8._12_4_ = (int)uVar6;
          goto LAB_001c2f73;
        }
        uStackY_530 = (ulong)uVar7;
        pcVar13 = "eval face derivatives";
        uVar11 = 0x25c;
        goto LAB_001c2f0b;
      }
      uStackY_530 = (ulong)uVar7;
      pcVar13 = "node list for edges";
      uVar11 = 0x24d;
    }
    else {
      uStackY_530 = (ulong)uVar7;
      pcVar13 = "get uv_orig";
      uVar11 = 0x249;
    }
  }
  else {
    uStackY_530 = (ulong)uVar7;
    pcVar13 = "get id";
    uVar11 = 0x248;
  }
LAB_001c2f0b:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar11,
         "ref_smooth_tri_pliant_uv",uStackY_530,pcVar13);
  pcVar13 = "ideal";
  uVar11 = 0x6d8;
LAB_001c1cb4:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar11,
         "ref_smooth_geom_face",uStackY_530,pcVar13);
  return (REF_STATUS)uStackY_530;
code_r0x001c2a7b:
  uVar7 = ref_smooth_add_pliant_force(pRVar1,node,*(REF_INT *)((long)uv + lVar9 * 4),&normdev);
  lVar9 = lVar9 + 1;
  if (uVar7 != 0) goto code_r0x001c2a9c;
  goto LAB_001c2a6e;
code_r0x001c2a9c:
  uStackY_530 = (ulong)uVar7;
  pcVar13 = "edge";
  uVar11 = 0x253;
  goto LAB_001c2f0b;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_geom_face(REF_GRID ref_grid, REF_INT node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_BOOL geom_node, geom_edge, geom_face, no_quads;
  REF_INT id;
  REF_DBL uv_orig[2], uv_ideal[2];
  REF_DBL qtet_orig, qtri_orig;
  REF_DBL qtri = 0.0, qtet = 0.0, min_uv_area, min_ratio, max_ratio;
  REF_DBL normdev_orig, normdev;
  REF_DBL backoff, uv[2];
  REF_INT tries, iuv;
  REF_DBL uv_min[2], uv_max[2];
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL pliant_smoothing = REF_FALSE;
  REF_BOOL accept;

  REF_BOOL verbose = REF_FALSE;

  if (!ref_cell_node_empty(ref_grid_qua(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pri(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_hex(ref_grid), node)) return REF_SUCCESS;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face check");
  no_quads = ref_cell_node_empty(ref_grid_qua(ref_grid), node);
  RAS(!geom_node, "geom node not allowed");
  RAS(!geom_edge, "geom edge not allowed");
  RAS(geom_face, "geom face required");
  RAS(no_quads, "quads not allowed");

  RSB(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "get-id",
      ref_clump_around(ref_grid, node, "get-id.tec"));
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_orig), "get uv_orig");
  if (ref_grid_surf(ref_grid)) {
    qtet_orig = 1.0;
  } else {
    RSB(ref_smooth_tet_quality_around(ref_grid, node, &qtet_orig), "q tet", {
      printf(" %f %f %f\n", ref_node_xyz(ref_node, 0, node),
             ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node));
    });
  }
  RSS(ref_smooth_tri_quality_around(ref_grid, node, &qtri_orig), "q tri");
  RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev_orig), "nd_orig");
  RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
      "ratio");
  pliant_smoothing = (qtri_orig > 0.5 && min_ratio > 0.5 && max_ratio < 2.0);
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  if (verbose)
    printf("uv %f %f tri %f tet %f\n", uv_orig[0], uv_orig[1], qtri_orig,
           qtet_orig);

  if (pliant_smoothing) {
    RSS(ref_smooth_tri_pliant_uv(ref_grid, node, uv_ideal), "ideal");
  } else {
    RSS(ref_smooth_tri_weighted_ideal_uv(ref_grid, node, uv_ideal), "ideal");
  }

  RSS(ref_geom_tri_uv_bounding_box(ref_grid, node, uv_min, uv_max), "bb");

  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    for (iuv = 0; iuv < 2; iuv++)
      uv[iuv] = backoff * uv_ideal[iuv] + (1.0 - backoff) * uv_orig[iuv];

    RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uv), "set uv");
    RSS(ref_geom_constrain(ref_grid, node), "constrain");
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");

    if (ref_grid_surf(ref_grid)) {
      qtet = 1.0;
      RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    } else {
      RSS(ref_smooth_tet_quality_around(ref_grid, node, &qtet), "q tet");
      RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    }
    RSS(ref_smooth_tri_quality_around(ref_grid, node, &qtri), "q tri");
    RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev), "nd");
    RSS(ref_smooth_tri_uv_area_around(ref_grid, node, &min_uv_area), "a");

    accept = (REF_SUCCESS == interp_status);
    accept = accept && (normdev > ref_grid_adapt(ref_grid, post_min_normdev) ||
                        normdev > normdev_orig);
    accept = accept && (normdev > 0.9 * normdev_orig);
    accept = accept && (min_uv_area > ref_node_min_uv_area(ref_node));
    accept = accept && (uv_min[0] < uv[0]) && (uv[0] < uv_max[0]);
    accept = accept && (uv_min[1] < uv[1]) && (uv[1] < uv_max[1]);
    accept = accept && (qtet > ref_grid_adapt(ref_grid, smooth_min_quality));
    accept = accept && (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio));
    accept = accept && (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio));
    if (pliant_smoothing) {
      accept = accept && (qtri > 0.9 * qtri_orig);
      accept = accept && (qtri > 0.4);
    } else {
      accept = accept && (qtri > qtri_orig);
    }

    if (accept) {
      if (verbose) printf("better qtri %f qtet %f\n", qtri, qtet);
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uv_orig), "set t");
  RSS(ref_geom_constrain(ref_grid, node), "constrain");
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  if (verbose)
    printf("undo qtri %f qtet %f was %f %f\n", qtri, qtet, qtri_orig,
           qtet_orig);

  return REF_SUCCESS;
}